

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

bool __thiscall BasePort::WriteAllBoards(BasePort *this)

{
  BoardIO *pBVar1;
  ostream *poVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  ulong uVar9;
  uchar *puVar10;
  quadlet_t ctrl;
  byte local_54;
  long *local_50 [2];
  long local_40 [2];
  
  iVar5 = (*this->_vptr_BasePort[0x11])();
  if ((char)iVar5 == '\0') {
    poVar2 = this->outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"BasePort::WriteAllBoards: port not initialized",0x2e);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
LAB_0010dd37:
    (*this->_vptr_BasePort[9])(this);
    return false;
  }
  if (this->Protocol_ - PROTOCOL_SEQ_R_BC_W < 2) {
    iVar5 = (*this->_vptr_BasePort[0x22])(this);
    return SUB41(iVar5,0);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"WriteAllBoards","");
  iVar5 = (*this->_vptr_BasePort[0x1b])(this,(string *)local_50,(ulong)this->autoReScan);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((char)iVar5 == '\0') goto LAB_0010dd37;
  this->rtWrite = true;
  if (this->max_board == 0) {
    bVar8 = true;
  }
  else {
    bVar8 = true;
    uVar9 = 0;
    local_54 = 1;
    do {
      if (this->BoardList[uVar9] != (BoardIO *)0x0) {
        puVar10 = this->WriteBufferBroadcast;
        uVar6 = (*this->_vptr_BasePort[0x17])(this);
        uVar7 = (*this->_vptr_BasePort[0x14])(this,2);
        puVar10 = puVar10 + (ulong)uVar7 + (ulong)uVar6;
        uVar6 = (*this->BoardList[uVar9]->_vptr_BoardIO[3])();
        pBVar1 = this->BoardList[uVar9];
        if (this->FirmwareVersion[uVar9] < 7) {
          uVar7 = (uVar6 >> 2) - 1;
          (*pBVar1->_vptr_BoardIO[4])(pBVar1,puVar10,0,(ulong)uVar7,1);
          iVar5 = (*this->_vptr_BasePort[0x27])(this,uVar9 & 0xff,0,puVar10,(ulong)(uVar6 - 4));
          bVar3 = (byte)iVar5;
          bVar8 = (bool)(bVar8 & bVar3);
          (*this->BoardList[uVar9]->_vptr_BoardIO[4])
                    (this->BoardList[uVar9],local_50,(ulong)uVar7,1,0);
          if ((int)local_50[0] == 0) {
            bVar4 = 1;
            if (bVar3 != 0) {
              local_54 = 0;
              bVar4 = 1;
              goto LAB_0010df3e;
            }
LAB_0010df4d:
            iVar5 = (*this->_vptr_BasePort[0x25])(this,uVar9 & 0xff);
            local_54 = local_54 & ((byte)iVar5 ^ 1);
          }
          else {
            iVar5 = (*this->_vptr_BasePort[0x24])(this,uVar9 & 0xff,0);
            bVar4 = (byte)iVar5;
            local_54 = local_54 & (bVar4 ^ 1) & (bVar3 ^ 1);
            bVar8 = (bool)(bVar8 & bVar4);
            if ((bVar3 == 0) && ((bVar4 ^ 1) != 0)) goto LAB_0010df4d;
LAB_0010df3e:
            iVar5 = (*this->BoardList[uVar9]->_vptr_BoardIO[6])();
            if ((char)iVar5 == '\0') goto LAB_0010df4d;
          }
          pBVar1 = this->BoardList[uVar9];
          pBVar1->writeValid = (bool)(bVar3 & bVar4);
          if ((bool)(bVar3 & bVar4) == false) {
            pBVar1->numWriteErrors = pBVar1->numWriteErrors + 1;
          }
          (*pBVar1->_vptr_BoardIO[5])();
        }
        else {
          (*pBVar1->_vptr_BoardIO[4])(pBVar1,puVar10,0,(ulong)(uVar6 >> 2),1);
          iVar5 = (*this->_vptr_BasePort[0x27])(this,uVar9 & 0xff,0,puVar10,(ulong)uVar6);
          pBVar1 = this->BoardList[uVar9];
          pBVar1->writeValid = SUB41(iVar5,0);
          if (SUB41(iVar5,0) == false) {
            pBVar1->numWriteErrors = pBVar1->numWriteErrors + 1;
            (*pBVar1->_vptr_BoardIO[5])();
            bVar8 = false;
          }
          else {
            (*pBVar1->_vptr_BoardIO[5])();
            (*this->BoardList[uVar9]->_vptr_BoardIO[7])();
            local_54 = 0;
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < this->max_board);
    if (local_54 == 0) goto LAB_0010dfa7;
  }
  (*this->_vptr_BasePort[9])(this);
LAB_0010dfa7:
  if (this->rtWrite != false) {
    return bVar8;
  }
  poVar2 = this->outStr;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"BasePort::WriteAllBoards: rtWrite is false",0x2a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return bVar8;
}

Assistant:

bool BasePort::WriteAllBoards(void)
{
    if (!IsOK()) {
        outStr << "BasePort::WriteAllBoards: port not initialized" << std::endl;
        OnNoneWritten();
        return false;
    }

    if ((Protocol_ == BasePort::PROTOCOL_SEQ_R_BC_W) || (Protocol_ == BasePort::PROTOCOL_BC_QRW)) {
        return WriteAllBoardsBroadcast();
    }

    if (!CheckFwBusGeneration("WriteAllBoards", autoReScan)) {
        OnNoneWritten();
        return false;
    }

    rtWrite = true;   // for debugging
    bool allOK = true;
    bool noneWritten = true;
    for (unsigned int board = 0; board < max_board; board++) {
        if (BoardList[board]) {
            quadlet_t *buf = reinterpret_cast<quadlet_t *>(WriteBufferBroadcast + GetWriteQuadAlign() + GetPrefixOffset(WR_FW_BDATA));
            unsigned int numBytes = BoardList[board]->GetWriteNumBytes();
            unsigned int numQuads = numBytes/sizeof(quadlet_t);
            if (FirmwareVersion[board] < 7) {
                // Rev 1-6 firmware: the last quadlet (Status/Control register)
                // is done as a separate quadlet write.
                BoardList[board]->GetWriteData(buf, 0, numQuads-1);
                bool noneWrittenThisBoard = true;
                bool ret = WriteBlock(board, 0, buf, numBytes-sizeof(quadlet_t));
                if (ret) { noneWritten = false; noneWrittenThisBoard = false; }
                else allOK = false;
                // Get last quadlet (false -> no byteswapping)
                quadlet_t ctrl;
                BoardList[board]->GetWriteData(&ctrl, numQuads-1, 1, false);
                bool ret2 = true;
                if (ctrl) {    // if anything non-zero, write it
                    ret2 = WriteQuadlet(board, 0, ctrl);
                    if (ret2) { noneWritten = false; noneWrittenThisBoard = false; }
                    else allOK = false;
                }
                if (noneWrittenThisBoard
                    || !(BoardList[board]->WriteBufferResetsWatchdog())) {
                    // send no-op to reset watchdog
                    bool ret3 = WriteNoOp(board);
                    if (ret3) noneWritten = false;
                }
                BoardList[board]->SetWriteValid(ret&&ret2);
                // Initialize (clear) the write buffer
                BoardList[board]->InitWriteBuffer();
            }
            else {
                // Rev 7 firmware: write DAC (x4) and Status/Control register
                BoardList[board]->GetWriteData(buf, 0, numQuads);
                bool ret = WriteBlock(board, 0, buf, numBytes);
                BoardList[board]->SetWriteValid(ret);
                // Initialize (clear) the write buffer
                BoardList[board]->InitWriteBuffer();
                if (ret) {
                    noneWritten = false;
                    // Check for data collection callback
                    BoardList[board]->CheckCollectCallback();
                }
                else {
                    allOK = false;
                }
            }
        }
    }
    if (noneWritten) {
        OnNoneWritten();
    }
    if (!rtWrite)
        outStr << "BasePort::WriteAllBoards: rtWrite is false" << std::endl;
    return allOK;
}